

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  ImVector<ImGuiTextFilter::TextRange> *out;
  int iVar1;
  TextRange *pTVar2;
  char *pcVar3;
  TextRange *__dest;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  TextRange input_range;
  TextRange local_38;
  
  out = &this->Filters;
  iVar1 = (this->Filters).Capacity;
  if (iVar1 < 0) {
    uVar6 = iVar1 / 2 + iVar1;
    uVar5 = 0;
    if (0 < (int)uVar6) {
      uVar5 = (ulong)uVar6;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (TextRange *)(*GImAllocatorAllocFunc)(uVar5 << 4,GImAllocatorUserData);
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      memcpy(__dest,pTVar2,(long)out->Size << 4);
    }
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    }
    (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = (int)uVar5;
  }
  (this->Filters).Size = 0;
  sVar4 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar4;
  local_38.b = this->InputBuf;
  TextRange::split(&local_38,',',out);
  this->CountGrep = 0;
  uVar6 = (this->Filters).Size;
  uVar5 = (ulong)uVar6;
  if (uVar6 != 0) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar7) {
LAB_0014911c:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      TextRange::trim_blanks((TextRange *)((long)&((this->Filters).Data)->b + lVar8));
      if ((long)(this->Filters).Size <= (long)uVar7) goto LAB_0014911c;
      pTVar2 = (this->Filters).Data;
      pcVar3 = *(char **)((long)&pTVar2->b + lVar8);
      if ((pcVar3 != *(char **)((long)&pTVar2->e + lVar8)) && (*pcVar3 != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar7 = uVar7 + 1;
      uVar5 = (ulong)(uint)out->Size;
      lVar8 = lVar8 + 0x10;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}